

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_name;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_7c = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_38 = local_28;
  sVar4 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,this + sVar4);
  if (local_7c < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
    goto LAB_00135a9f;
  }
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_38,local_30 + (long)local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_78,":");
  StreamableToString<int>(&local_58,&local_7c);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    uVar6 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_58._M_string_length + local_78._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar6 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_58._M_string_length + local_78._M_string_length) goto LAB_001359ec;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
LAB_001359ec:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar6 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_00135a9f:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}